

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazyExtensionRangeEmitter::AddToRange(google::protobuf::Descriptor::
ExtensionRange_const__(void *this,ExtensionRange *range)

{
  int *piVar1;
  ExtensionRange *range_local;
  LazyExtensionRangeEmitter *this_local;
  
  if ((*(byte *)((long)this + 0x40) & 1) == 0) {
    *(undefined8 *)((long)this + 0x48) = *(undefined8 *)range;
    *(ExtensionRangeOptions **)((long)this + 0x50) = range->options_;
    *(undefined1 *)((long)this + 0x40) = 1;
  }
  else {
    piVar1 = std::min<int>((int *)((long)this + 0x48),&range->start);
    *(int *)((long)this + 0x48) = *piVar1;
    piVar1 = std::max<int>((int *)((long)this + 0x4c),&range->end);
    *(int *)((long)this + 0x4c) = *piVar1;
  }
  return;
}

Assistant:

void AddToRange(const Descriptor::ExtensionRange* range) {
      if (!has_current_range_) {
        current_combined_range_ = *range;
        has_current_range_ = true;
      } else {
        current_combined_range_.start =
            std::min(current_combined_range_.start, range->start);
        current_combined_range_.end =
            std::max(current_combined_range_.end, range->end);
      }
    }